

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

uint16_t get_attr_pos(lyd_attr *attr,lyd_node *parent)

{
  lyd_attr *plVar1;
  uint16_t uVar2;
  lyd_attr **pplVar3;
  
  uVar2 = 0;
  pplVar3 = &parent->attr;
  while ((plVar1 = *pplVar3, plVar1 != (lyd_attr *)0x0 && (plVar1 != attr))) {
    uVar2 = uVar2 + 1;
    pplVar3 = &plVar1->next;
  }
  if (plVar1 != (lyd_attr *)0x0) {
    return uVar2;
  }
  __assert_fail("attr2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                ,0x48b,"uint16_t get_attr_pos(struct lyd_attr *, const struct lyd_node *)");
}

Assistant:

static uint16_t
get_attr_pos(struct lyd_attr *attr, const struct lyd_node *parent)
{
    uint16_t pos = 0;
    struct lyd_attr *attr2;

    for (attr2 = parent->attr; attr2 && (attr2 != attr); attr2 = attr2->next) {
        ++pos;
    }

    assert(attr2);
    return pos;
}